

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

void __thiscall helics::udp::UdpServer::~UdpServer(UdpServer *this)

{
  long in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffb0;
  undefined1 local_28 [40];
  
  stop_receive((UdpServer *)0x217498);
  CLI::std::error_code::error_code(in_stack_ffffffffffffffb0);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::close
            ((basic_socket<asio::ip::udp,_asio::any_io_executor> *)(in_RDI + 0x10),(int)local_28);
  CLI::std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>::
  ~function((function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)> *
            )0x21752e);
  ::asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::~basic_datagram_socket
            ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)0x21753c);
  CLI::std::enable_shared_from_this<helics::udp::UdpServer>::~enable_shared_from_this
            ((enable_shared_from_this<helics::udp::UdpServer> *)0x217546);
  return;
}

Assistant:

~UdpServer()
        {
            try {
                stop_receive();
            }
            catch (...) {
            }
            try {
                asio::error_code ec;
                mSocket.close(ec);
            }
            catch (...) {
            }
        }